

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall cashew::JSPrinter::printIf(JSPrinter *this,Ref node)

{
  size_t sVar1;
  bool bVar2;
  undefined8 *puVar3;
  Ref local_20;
  Ref node_local;
  
  local_20.inst = node.inst;
  emit(this,"if");
  safeSpace(this);
  maybeSpace(this,'(');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = '(';
  puVar3 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
  print(this,(Value *)*puVar3);
  maybeSpace(this,')');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = ')';
  space(this);
  puVar3 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
  bVar2 = isBlock((Value *)*puVar3);
  if (bVar2) {
    puVar3 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
    print(this,(Value *)*puVar3);
  }
  else {
    maybeSpace(this,'{');
    ensure(this,1);
    sVar1 = this->used;
    this->used = sVar1 + 1;
    this->buffer[sVar1] = '{';
    this->indent = this->indent + 1;
    newline(this);
    puVar3 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
    print(this,(Value *)*puVar3);
    this->indent = this->indent + -1;
    newline(this);
    emit(this,'}');
  }
  bVar2 = ifHasElse(local_20);
  if (bVar2) {
    space(this);
    emit(this,"else");
    safeSpace(this);
    puVar3 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
    bVar2 = isBlock((Value *)*puVar3);
    if (bVar2) {
      puVar3 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
      print(this,(Value *)*puVar3);
    }
    else {
      maybeSpace(this,'{');
      ensure(this,1);
      sVar1 = this->used;
      this->used = sVar1 + 1;
      this->buffer[sVar1] = '{';
      this->indent = this->indent + 1;
      newline(this);
      puVar3 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
      print(this,(Value *)*puVar3);
      this->indent = this->indent + -1;
      newline(this);
      emit(this,'}');
    }
  }
  return;
}

Assistant:

void printIf(Ref node) {
    emit("if");
    safeSpace();
    emit('(');
    print(node[1]);
    emit(')');
    space();
    bool emitsBracesAnyhow = isBlock(node[2]);
    if (!emitsBracesAnyhow) {
      emit('{');
      indent++;
      newline();
    }
    print(node[2]);
    if (!emitsBracesAnyhow) {
      indent--;
      newline();
      emit('}');
    }
    if (ifHasElse(node)) {
      space();
      emit("else");
      safeSpace();
      bool emitsBracesAnyhow = isBlock(node[3]);
      if (!emitsBracesAnyhow) {
        emit('{');
        indent++;
        newline();
      }
      print(node[3]);
      if (!emitsBracesAnyhow) {
        indent--;
        newline();
        emit('}');
      }
    }
  }